

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::impl::NumberStringBuilder::toTempUnicodeString
          (UnicodeString *__return_storage_ptr__,NumberStringBuilder *this)

{
  ValueOrHeapArray<char16_t> *pVVar1;
  ConstChar16Ptr local_20 [3];
  
  if (this->fUsingHeap == false) {
    pVVar1 = &this->fChars;
  }
  else {
    pVVar1 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
  }
  local_20[0].p_ = (char16_t *)((long)pVVar1 + (long)this->fZero * 2);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\0',local_20,this->fLength);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString NumberStringBuilder::toTempUnicodeString() const {
    // Readonly-alias constructor:
    return UnicodeString(FALSE, getCharPtr() + fZero, fLength);
}